

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

void __thiscall TypeChecker::visit(TypeChecker *this,FunctionCallNode *node)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  optional<std::reference_wrapper<Symbol>_> oVar3;
  string name;
  FunctionAnalyser analyser;
  string local_70;
  FunctionAnalyser local_50;
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (node->name_)._M_string_length);
  oVar3 = SymbolTable::lookup(this->symbols_,&local_70,0);
  if (((undefined1  [16])
       oVar3.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::__throw_bad_optional_access();
  }
  FunctionAnalyser::FunctionAnalyser(&local_50);
  (**(code **)(*(long *)oVar3.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar3.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,&local_50);
  (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)
       local_50.returnType_.super__Optional_base<TypeName,_true,_true>._M_payload.
       super__Optional_payload_base<TypeName>;
  local_50.super_SymbolVisitor._vptr_SymbolVisitor = (_func_int **)&PTR__FunctionAnalyser_001e94b8;
  while (local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_50.arguments_) {
    p_Var2 = (local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl.
              _M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>.
                    _M_impl._M_node.super__List_node_base._M_next,0x18);
    local_50.arguments_.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TypeChecker::visit(const FunctionCallNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  FunctionAnalyser analyser{};
  symbol.accept(analyser);
  type_ = analyser.getReturnType();
}